

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::sr::anon_unknown_0::SparseShaderTextureFunctionCase::createInstance
          (SparseShaderTextureFunctionCase *this,Context *context)

{
  ShaderTextureFunctionInstance *this_00;
  
  this_00 = (ShaderTextureFunctionInstance *)operator_new(0x228);
  ShaderTextureFunctionInstance::ShaderTextureFunctionInstance
            (this_00,context,
             (this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.m_isVertexCase,
             (this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderTextureFunctionCase).super_ShaderRenderCase.m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,&(this->super_ShaderTextureFunctionCase).m_lookupSpec,
             &(this->super_ShaderTextureFunctionCase).m_textureSpec,
             &(this->super_ShaderTextureFunctionCase).m_lookupParams,IMAGE_BACKING_MODE_SPARSE);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00d269c8;
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* SparseShaderTextureFunctionCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new SparseShaderTextureFunctionInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_lookupSpec, m_textureSpec, m_lookupParams);
}